

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O0

void __thiscall
QPDFPageObjectHelper::copyAnnotations
          (QPDFPageObjectHelper *this,QPDFPageObjectHelper *from_page,QPDFMatrix *cm,
          QPDFAcroFormDocumentHelper *afdh,QPDFAcroFormDocumentHelper *from_afdh)

{
  pointer *this_00;
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  QPDF *this_01;
  unsigned_long_long uVar3;
  unsigned_long_long uVar4;
  logic_error *this_02;
  reference item;
  QPDFObjectHandle *annot;
  iterator __end1;
  iterator __begin1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range1;
  allocator<char> local_259;
  QPDFObjectHandle local_258 [2];
  undefined1 local_238 [40];
  string local_210 [32];
  QPDFObjectHandle annots;
  QPDFObjectHandle local_1b8;
  shared_ptr<QPDFAcroFormDocumentHelper> local_1a8;
  shared_ptr<QPDFAcroFormDocumentHelper> local_198;
  undefined1 local_188 [8];
  shared_ptr<QPDFAcroFormDocumentHelper> from_afdhph;
  shared_ptr<QPDFAcroFormDocumentHelper> afdhph;
  set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> old_fields;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> new_fields;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> new_annots;
  string local_100;
  undefined1 local_e0 [24];
  QPDF *this_qpdf;
  string local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  QPDF *from_qpdf;
  allocator<char> local_71;
  string local_70 [32];
  QPDFObjectHandle old_annots;
  QPDFAcroFormDocumentHelper *from_afdh_local;
  QPDFAcroFormDocumentHelper *afdh_local;
  QPDFMatrix *cm_local;
  QPDFPageObjectHelper *from_page_local;
  QPDFPageObjectHelper *this_local;
  
  old_annots.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)from_afdh;
  QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)&stack0xffffffffffffffb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_70,"/Annots",&local_71);
  QPDFObjectHandle::getKey
            ((QPDFObjectHandle *)&stack0xffffffffffffffc0,(string *)&stack0xffffffffffffffb0);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffffb0);
  bVar1 = QPDFObjectHandle::isArray((QPDFObjectHandle *)&stack0xffffffffffffffc0);
  if (bVar1) {
    QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)&stack0xffffffffffffff60);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,
               "QPDFPageObjectHelper::copyAnnotations: from page is a direct object",
               (allocator<char> *)((long)&this_qpdf + 7));
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             QPDFObjectHandle::getQPDF((QPDFObjectHandle *)&stack0xffffffffffffff60,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&this_qpdf + 7));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffff60);
    local_90._M_pi = p_Var2;
    QPDFObjectHelper::oh((QPDFObjectHelper *)local_e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,
               "QPDFPageObjectHelper::copyAnnotations: this page is a direct object",
               (allocator<char> *)
               ((long)&new_annots.
                       super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             QPDFObjectHandle::getQPDF((QPDFObjectHandle *)local_e0,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&new_annots.
                       super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_e0);
    local_e0._16_8_ = p_Var2;
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
               &new_fields.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
               &old_fields._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::set
              ((set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)
               &afdhph.super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::shared_ptr<QPDFAcroFormDocumentHelper>::shared_ptr
              ((shared_ptr<QPDFAcroFormDocumentHelper> *)
               &from_afdhph.
                super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::shared_ptr<QPDFAcroFormDocumentHelper>::shared_ptr
              ((shared_ptr<QPDFAcroFormDocumentHelper> *)local_188);
    from_afdh_local = afdh;
    if (afdh == (QPDFAcroFormDocumentHelper *)0x0) {
      std::make_shared<QPDFAcroFormDocumentHelper,QPDF&>((QPDF *)&local_198);
      std::shared_ptr<QPDFAcroFormDocumentHelper>::operator=
                ((shared_ptr<QPDFAcroFormDocumentHelper> *)
                 &from_afdhph.
                  super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,&local_198);
      std::shared_ptr<QPDFAcroFormDocumentHelper>::~shared_ptr(&local_198);
      from_afdh_local =
           std::__shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2> *)
                      &from_afdhph.
                       super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._16_8_ == local_90._M_pi) {
      old_annots.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)from_afdh_local;
    }
    else if (old_annots.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::make_shared<QPDFAcroFormDocumentHelper,QPDF&>((QPDF *)&local_1a8);
      std::shared_ptr<QPDFAcroFormDocumentHelper>::operator=
                ((shared_ptr<QPDFAcroFormDocumentHelper> *)local_188,&local_1a8);
      std::shared_ptr<QPDFAcroFormDocumentHelper>::~shared_ptr(&local_1a8);
      old_annots.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::__shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2> *)
                      local_188);
    }
    else {
      this_01 = QPDFDocumentHelper::getQPDF
                          ((QPDFDocumentHelper *)
                           old_annots.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi);
      uVar3 = QPDF::getUniqueId(this_01);
      uVar4 = QPDF::getUniqueId((QPDF *)local_90._M_pi);
      if (uVar3 != uVar4) {
        this_02 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error
                  (this_02,
                   "QPDFAcroFormDocumentHelper::copyAnnotations: from_afdh is not from the same QPDF as from_page"
                  );
        __cxa_throw(this_02,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
    QPDFObjectHandle::QPDFObjectHandle(&local_1b8,(QPDFObjectHandle *)&stack0xffffffffffffffc0);
    QPDFAcroFormDocumentHelper::transformAnnotations
              (from_afdh_local,&local_1b8,
               (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
               &new_fields.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
               &old_fields._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)
               &afdhph.super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,cm,(QPDF *)local_90._M_pi,
               (QPDFAcroFormDocumentHelper *)
               old_annots.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    QPDFObjectHandle::~QPDFObjectHandle(&local_1b8);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
               &annots.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
               &old_fields._M_t._M_impl.super__Rb_tree_header._M_node_count);
    QPDFAcroFormDocumentHelper::addAndRenameFormFields
              (from_afdh_local,
               (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
               &annots.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
               &annots.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    QPDFObjectHelper::oh((QPDFObjectHelper *)&stack0xfffffffffffffe10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_210,"/Annots",(allocator<char> *)(local_238 + 0x27));
    QPDFObjectHandle::getKey
              ((QPDFObjectHandle *)&stack0xfffffffffffffe20,(string *)&stack0xfffffffffffffe10);
    std::__cxx11::string::~string(local_210);
    std::allocator<char>::~allocator((allocator<char> *)(local_238 + 0x27));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xfffffffffffffe10);
    bVar1 = QPDFObjectHandle::isArray((QPDFObjectHandle *)&stack0xfffffffffffffe20);
    if (!bVar1) {
      QPDFObjectHelper::oh((QPDFObjectHelper *)local_238);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_258,"/Annots",&local_259);
      QPDFObjectHandle::newArray();
      QPDFObjectHandle::replaceKeyAndGetNew
                ((QPDFObjectHandle *)(local_238 + 0x10),(string *)local_238,local_258);
      QPDFObjectHandle::operator=
                ((QPDFObjectHandle *)&stack0xfffffffffffffe20,(QPDFObjectHandle *)(local_238 + 0x10)
                );
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_238 + 0x10));
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&__range1);
      std::__cxx11::string::~string((string *)local_258);
      std::allocator<char>::~allocator(&local_259);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_238);
    }
    this_00 = &new_fields.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    __end1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin
                       ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)this_00);
    annot = (QPDFObjectHandle *)
            std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end
                      ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                       *)&annot), bVar1) {
      item = __gnu_cxx::
             __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
             ::operator*(&__end1);
      QPDFObjectHandle::appendItem((QPDFObjectHandle *)&stack0xfffffffffffffe20,item);
      __gnu_cxx::
      __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
      ::operator++(&__end1);
    }
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xfffffffffffffe20);
    std::shared_ptr<QPDFAcroFormDocumentHelper>::~shared_ptr
              ((shared_ptr<QPDFAcroFormDocumentHelper> *)local_188);
    std::shared_ptr<QPDFAcroFormDocumentHelper>::~shared_ptr
              ((shared_ptr<QPDFAcroFormDocumentHelper> *)
               &from_afdhph.
                super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::~set
              ((set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)
               &afdhph.super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
               &old_fields._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
               &new_fields.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    from_qpdf._0_4_ = 0;
  }
  else {
    from_qpdf._0_4_ = 1;
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

void
QPDFPageObjectHelper::copyAnnotations(
    QPDFPageObjectHelper from_page,
    QPDFMatrix const& cm,
    QPDFAcroFormDocumentHelper* afdh,
    QPDFAcroFormDocumentHelper* from_afdh)
{
    auto old_annots = from_page.getObjectHandle().getKey("/Annots");
    if (!old_annots.isArray()) {
        return;
    }

    QPDF& from_qpdf = from_page.getObjectHandle().getQPDF(
        "QPDFPageObjectHelper::copyAnnotations: from page is a direct object");
    QPDF& this_qpdf =
        oh().getQPDF("QPDFPageObjectHelper::copyAnnotations: this page is a direct object");

    std::vector<QPDFObjectHandle> new_annots;
    std::vector<QPDFObjectHandle> new_fields;
    std::set<QPDFObjGen> old_fields;
    std::shared_ptr<QPDFAcroFormDocumentHelper> afdhph;
    std::shared_ptr<QPDFAcroFormDocumentHelper> from_afdhph;
    if (!afdh) {
        afdhph = std::make_shared<QPDFAcroFormDocumentHelper>(this_qpdf);
        afdh = afdhph.get();
    }
    if (&this_qpdf == &from_qpdf) {
        from_afdh = afdh;
    } else if (from_afdh) {
        if (from_afdh->getQPDF().getUniqueId() != from_qpdf.getUniqueId()) {
            throw std::logic_error(
                "QPDFAcroFormDocumentHelper::copyAnnotations: from_afdh"
                " is not from the same QPDF as from_page");
        }
    } else {
        from_afdhph = std::make_shared<QPDFAcroFormDocumentHelper>(from_qpdf);
        from_afdh = from_afdhph.get();
    }

    afdh->transformAnnotations(
        old_annots, new_annots, new_fields, old_fields, cm, &from_qpdf, from_afdh);
    afdh->addAndRenameFormFields(new_fields);
    auto annots = oh().getKey("/Annots");
    if (!annots.isArray()) {
        annots = oh().replaceKeyAndGetNew("/Annots", QPDFObjectHandle::newArray());
    }
    for (auto const& annot: new_annots) {
        annots.appendItem(annot);
    }
}